

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmainwindowlayout.cpp
# Opt level: O2

void __thiscall
QMainWindowLayout::addDockWidget
          (QMainWindowLayout *this,DockWidgetArea area,QDockWidget *dockwidget,
          Orientation orientation)

{
  DockPosition pos;
  
  QLayout::addChildWidget((QLayout *)this,&dockwidget->super_QWidget);
  if (*(long *)(this + 0x68) != 0) {
    QMainWindowLayoutSeparatorHelper<QMainWindowLayout>::endSeparatorMove
              ((QMainWindowLayoutSeparatorHelper<QMainWindowLayout> *)(this + 0x20),
               (QPoint *)(this + 0x78));
  }
  pos = toDockPos(area);
  QDockAreaLayout::addDockWidget((QDockAreaLayout *)(this + 0x1a0),pos,dockwidget,orientation);
  (**(code **)(*(long *)this + 0x70))(this);
  return;
}

Assistant:

void QMainWindowLayout::addDockWidget(Qt::DockWidgetArea area,
                                             QDockWidget *dockwidget,
                                             Qt::Orientation orientation)
{
    addChildWidget(dockwidget);

    // If we are currently moving a separator, then we need to abort the move, since each
    // time we move the mouse layoutState is replaced by savedState modified by the move.
    if (!movingSeparator.isEmpty())
        endSeparatorMove(movingSeparatorPos);

    layoutState.dockAreaLayout.addDockWidget(toDockPos(area), dockwidget, orientation);
    invalidate();
}